

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O1

void __thiscall
stateObservation::ZeroDelayObserver::pushMeasurement(ZeroDelayObserver *this,MeasureVector *y_k)

{
  _Map_pointer ppMVar1;
  int iVar2;
  
  iVar2 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x18])();
  if ((char)iVar2 == '\0') {
    __assert_fail("checkMeasureVector(y_k) && \"The size of the measure vector is incorrect\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x43,
                  "virtual void stateObservation::ZeroDelayObserver::pushMeasurement(const ObserverBase::MeasureVector &)"
                 );
  }
  ppMVar1 = (this->y_).v_.
            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (0 < (long)(((long)(this->y_).v_.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last -
                  (long)(this->y_).v_.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                 ((long)(this->y_).v_.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)(this->y_).v_.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                ((((ulong)((long)ppMVar1 -
                          (long)(this->y_).v_.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (ulong)(ppMVar1 == (_Map_pointer)0x0)) * 0x20)) {
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(&(this->y_).v_,y_k);
    return;
  }
  if ((this->x_).super_DebugItem<bool,_stateObservation::DebugItemDefaultValue<bool,_true>,_true>.b_
      != false) {
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue(&this->y_,y_k,(this->x_).k_ + 1);
    return;
  }
  __assert_fail("x_.isSet() && \"Unable to initialize measurement without time index, the state vector has not been set.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                ,0x4b,
                "virtual void stateObservation::ZeroDelayObserver::pushMeasurement(const ObserverBase::MeasureVector &)"
               );
}

Assistant:

void ZeroDelayObserver::pushMeasurement(const ObserverBase::MeasureVector & y_k)
{

  BOOST_ASSERT(checkMeasureVector(y_k) && "The size of the measure vector is incorrect");
  if(y_.size() > 0)
  {
    y_.pushBack(y_k);
  }
  else
  {
    BOOST_ASSERT(x_.isSet()
                 && "Unable to initialize measurement without time index, the state vector has not been set.");
    /// we need the measurement of the next state to correct for the prediction
    y_.setValue(y_k, x_.getTime() + 1);
  }
}